

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderIntegerFunctionTests.cpp
# Opt level: O1

bool __thiscall
vkt::shaderexecutor::BitfieldInsertCaseInstance::compare
          (BitfieldInsertCaseInstance *this,void **inputs,void **outputs)

{
  pointer pSVar1;
  long lVar2;
  int iVar3;
  ostream *stream;
  byte bVar4;
  ostringstream *this_00;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  Hex<8UL> local_30;
  
  pSVar1 = (this->super_IntegerFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = *(uint *)((long)&(pSVar1->varType).m_data + 4);
  iVar3 = glu::getDataTypeScalarSize((pSVar1->varType).m_data.basic.type);
  bVar5 = iVar3 < 1;
  if (0 < iVar3) {
    uVar6 = (2 << ((&DAT_00b58ea8)[(ulong)uVar6 * 4] - 1 & 0x1f)) - 1;
    uVar7 = ~(-1 << ((byte)*inputs[3] & 0x1f));
    if (*inputs[3] == 0x20) {
      uVar7 = 0xffffffff;
    }
    bVar4 = (byte)*inputs[2];
    uVar8 = ~(uVar7 << (bVar4 & 0x1f));
    uVar10 = (*inputs[1] & uVar7) << (bVar4 & 0x1f) | **inputs & uVar8;
    lVar9 = 0;
    if (((**outputs ^ uVar10) & uVar6) == 0) {
      lVar9 = 0;
      do {
        if (iVar3 + -1 == (int)lVar9) {
          return true;
        }
        uVar10 = (*(uint *)((long)inputs[1] + (lVar9 + 1) * 4) & uVar7) << (bVar4 & 0x1f) |
                 *(uint *)((long)*inputs + (lVar9 + 1) * 4) & uVar8;
        lVar2 = lVar9 + 1;
        lVar9 = lVar9 + 1;
      } while (((*(uint *)((long)*outputs + lVar2 * 4) ^ uVar10) & uVar6) == 0);
      bVar5 = iVar3 <= (int)lVar9;
    }
    this_00 = &(this->super_IntegerFunctionTestInstance).m_failMsg;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Expected [",10);
    stream = (ostream *)std::ostream::operator<<(this_00,(int)lVar9);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"] = ",4);
    local_30.value = (deUint64)uVar10;
    tcu::Format::Hex<8UL>::toStream(&local_30,stream);
  }
  return bVar5;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		const int				integerLength	= getShaderUintBitCount(m_shaderType, precision);
		const deUint32			cmpMask			= getLowBitMask(integerLength);
		const int				offset			= *((const int*)inputs[2]);
		const int				bits			= *((const int*)inputs[3]);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const deUint32	base	= ((const deUint32*)inputs[0])[compNdx];
			const deUint32	insert	= ((const deUint32*)inputs[1])[compNdx];
			const deInt32	out		= ((const deUint32*)outputs[0])[compNdx];

			const deUint32	mask	= bits == 32 ? ~0u : (1u<<bits)-1;
			const deUint32	ref		= (base & ~(mask<<offset)) | ((insert & mask)<<offset);

			if ((out&cmpMask) != (ref&cmpMask))
			{
				m_failMsg << "Expected [" << compNdx << "] = " << tcu::toHex(ref);
				return false;
			}
		}

		return true;
	}